

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_by_value.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  Task *pTVar2;
  uint uVar3;
  int iVar4;
  Workitem *this;
  Task *itask;
  undefined8 *puVar5;
  ostream *this_00;
  long *plVar6;
  char *pcVar7;
  ulong uVar8;
  arg_info *pargs;
  arg_info *local_38;
  
  uVar3 = std::thread::hardware_concurrency();
  if (uVar3 < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TEST SKIPPED (requires 2 HW threads)\n",0x25);
    uVar8 = 0;
  }
  else {
    t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    depspawn::spawn<void(int_volatile&),int&>(f,&i);
    i = 0x14;
    depspawn::spawn<void(int&,int),int&,int>(h,&j,&i);
    local_38 = (arg_info *)0x0;
    iVar4 = depspawn::internal::
            fill_args<boost::mpl::v_iter<boost::function_types::parameter_types<void(int&,int),boost::add_reference<mpl_::arg<_1>>>,0l>,int&,int&>
                      (&local_38,&i,&i);
    if ((depspawn::internal::TP == (Task *)0x0) ||
       (*(char *)&depspawn::internal::TP[10].next == '\x01')) {
      depspawn::internal::start_master();
    }
    this = LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc
                     ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
                      depspawn::internal::Workitem::Pool);
    depspawn::internal::Workitem::Workitem(this,local_38,iVar4);
    pTVar2 = depspawn::internal::TP;
    itask = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
                      ((LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *)
                       &depspawn::internal::TP[9].next);
    *(undefined8 *)&(itask->func_).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(itask->func_).super__Function_base._M_functor + 8) = 0;
    (itask->func_).super__Function_base._M_manager = (_Manager_type)0x0;
    (itask->func_)._M_invoker = (_Invoker_type)0x0;
    puVar5 = (undefined8 *)operator_new(0x18);
    *puVar5 = h;
    puVar5[1] = &i;
    puVar5[2] = &i;
    *(undefined8 **)&(itask->func_).super__Function_base._M_functor = puVar5;
    (itask->func_)._M_invoker =
         std::
         _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<int>,_std::reference_wrapper<int>))(int_&,_int)>_>
         ::_M_invoke;
    (itask->func_).super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<int>,_std::reference_wrapper<int>))(int_&,_int)>_>
         ::_M_manager;
    itask->ctx_ = this;
    itask->next = pTVar2;
    depspawn::internal::Workitem::insert_in_worklist(this,itask);
    depspawn::wait_for_all();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Final i=",8);
    this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,i);
    std::__ostream_insert<char,std::char_traits<char>>(this_00," j=",3);
    plVar6 = (long *)std::ostream::operator<<(this_00,j);
    std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
    std::ostream::put((char)plVar6);
    std::ostream::flush();
    iVar1 = j;
    iVar4 = i;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TEST ",5);
    uVar8 = (ulong)(iVar1 != 0x14 || iVar4 != 0x14);
    pcVar7 = "SUCCESSFUL";
    if (iVar1 != 0x14 || iVar4 != 0x14) {
      pcVar7 = "UNSUCCESSFUL";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,uVar8 * 2 + 10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
  }
  return (int)uVar8;
}

Assistant:

int main()
{
  
  if (std::thread::hardware_concurrency() < 2 ) {
    std::cout << "TEST SKIPPED (requires 2 HW threads)\n";
    return 0;
  }

  t0 = std::chrono::high_resolution_clock::now();

  spawn(f, i);      //f runs for long. Sets i=10
  
  i = 20;
  
  // Because of the use of std::move(i)
  // (1) h does not depend on f and thus does not wait for it
  // (2) h uses the inmediate value of i(20)
  spawn(h, j, std::move(i));
  
  // Although i was set to 20, f sets it to 10 much later
  // h proves that although the second argument (s) is passed by value,
  // it is binded/provided to the function ONLY after f finishes, thus
  // adquiring the value 10, not 20
  spawn(h, i, i);
  
  wait_for_all();

  std::cout << "Final i=" << i << " j=" << j << std::endl;
  
  const bool test_ok = (i == 20) && (j == 20);
  
  std::cout << "TEST " << (test_ok ? "SUCCESSFUL" : "UNSUCCESSFUL") << std::endl;
  
  return !test_ok;
}